

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DynamicScalableKReach.cpp
# Opt level: O3

void __thiscall
DynamicScalableKReach::DynamicPartialIndex::update_insert
          (DynamicPartialIndex *this,vertex_t v,
          vector<unsigned_int,_std::allocator<unsigned_int>_> *out,
          vector<unsigned_int,_std::allocator<unsigned_int>_> *in,
          vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
          *graph,vector<unsigned_char,_std::allocator<unsigned_char>_> *dist)

{
  byte bVar1;
  byte bVar2;
  uint *puVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  uint *puVar7;
  pointer puVar8;
  
  uVar4 = (ulong)v;
  puVar8 = (dist->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
           super__Vector_impl_data._M_start;
  uVar5 = (long)(dist->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
                super__Vector_impl_data._M_finish - (long)puVar8;
  uVar6 = uVar4;
  if (uVar4 < uVar5) {
    bVar1 = puVar8[uVar4];
    puVar7 = (in->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
             super__Vector_impl_data._M_start;
    puVar3 = (in->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
             super__Vector_impl_data._M_finish;
    if (puVar7 != puVar3) {
      do {
        uVar6 = (ulong)*puVar7;
        puVar8 = (dist->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        uVar5 = (long)(dist->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                      _M_impl.super__Vector_impl_data._M_finish - (long)puVar8;
        if (uVar5 <= uVar6) goto LAB_0010d36f;
        bVar2 = puVar8[uVar6];
        if (bVar2 < this->k_) {
          uVar6 = uVar4;
          if (uVar5 <= uVar4) goto LAB_0010d36f;
          if (bVar2 + 1 < (uint)puVar8[uVar4]) {
            puVar8[uVar4] = bVar2 + 1;
          }
        }
        puVar7 = puVar7 + 1;
      } while (puVar7 != puVar3);
      puVar8 = (dist->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
               super__Vector_impl_data._M_start;
      uVar5 = (long)(dist->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                    _M_impl.super__Vector_impl_data._M_finish - (long)puVar8;
    }
    uVar6 = uVar4;
    if (uVar4 < uVar5) {
      if (puVar8[uVar4] < this->k_) {
        if (puVar8[uVar4] < bVar1) {
          resume_bfs(this,v,graph,dist);
          return;
        }
        puVar3 = (out->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                 super__Vector_impl_data._M_finish;
        for (puVar7 = (out->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl
                      .super__Vector_impl_data._M_start; puVar7 != puVar3; puVar7 = puVar7 + 1) {
          puVar8 = (dist->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl
                   .super__Vector_impl_data._M_start;
          uVar5 = (long)(dist->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                        _M_impl.super__Vector_impl_data._M_finish - (long)puVar8;
          uVar6 = uVar4;
          if ((uVar5 <= uVar4) || (uVar6 = (ulong)*puVar7, uVar5 <= uVar6)) goto LAB_0010d36f;
          if (puVar8[uVar4] + 1 < (uint)puVar8[uVar6]) {
            puVar8[uVar6] = puVar8[uVar4] + 1;
            resume_bfs(this,*puVar7,graph,dist);
          }
        }
      }
      return;
    }
  }
LAB_0010d36f:
  std::__throw_out_of_range_fmt
            ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",uVar6,uVar5
            );
}

Assistant:

void DynamicScalableKReach::DynamicPartialIndex::update_insert(vertex_t v, const std::vector<vertex_t> &out,
                                                               const std::vector<vertex_t> &in,
                                                               const std::vector<std::vector<vertex_t>> &graph,
                                                               std::vector<distance_t> &dist) {
    auto d = dist.at(v);
    for (const auto &s : in){
        if (dist.at(s) < k_ && dist.at(s) + 1 < dist.at(v)){
            dist.at(v) = dist.at(s) + 1;
        }
    }

    if (dist.at(v) >= k_){
        return;
    }

    if (dist.at(v) < d){
        resume_bfs(v, graph, dist);
    }
    else {
        for (const auto &t : out) {
            if (dist.at(v) + 1 < dist.at(t)){
                dist.at(t) = dist.at(v) + 1;
                resume_bfs(t, graph, dist);
            }
        }
    }
}